

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O1

Config * jaegertracing::Config::parse(Config *__return_storage_ptr__,Node *configYAML)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  char (*in_R8) [1];
  Node headersNode;
  Node reporterNode;
  Node baggageRestrictionsNode;
  Node samplerNode;
  duration local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> serviceName;
  undefined1 local_1d8 [32];
  RestrictionsConfig baggageRestrictions;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_188;
  duration local_168;
  HeadersConfig headers;
  Config reporter;
  Config sampler;
  
  if ((configYAML->m_isValid == true) &&
     (((configYAML->m_pNode == (node *)0x0 ||
       (*(char *)**(undefined8 **)configYAML->m_pNode == '\x01')) &&
      (bVar4 = YAML::Node::IsMap(configYAML), bVar4)))) {
    utils::yaml::findOrDefault<std::__cxx11::string,char[13],char[1]>
              (&serviceName,(yaml *)configYAML,(Node *)"service_name",(char (*) [13])0x111062,in_R8)
    ;
    headers._jaegerDebugHeader._M_dataplus._M_p._0_1_ = 0;
    bVar4 = utils::yaml::findOrDefault<bool,char[9],bool>
                      (configYAML,(char (*) [9])"disabled",(bool *)&headers);
    YAML::Node::operator[]<char[8]>(&samplerNode,configYAML,(char (*) [8])"sampler");
    samplers::Config::parse(&sampler,&samplerNode);
    YAML::Node::operator[]<char[9]>(&reporterNode,configYAML,(char (*) [9])"reporter");
    reporters::Config::parse(&reporter,&reporterNode);
    YAML::Node::operator[]<char[8]>(&headersNode,configYAML,(char (*) [8])"headers");
    propagation::HeadersConfig::parse(&headers,&headersNode);
    YAML::Node::operator[]<char[21]>
              (&baggageRestrictionsNode,configYAML,(char (*) [21])"baggage_restrictions");
    baggage::RestrictionsConfig::parse(&baggageRestrictions,&baggageRestrictionsNode);
    local_1d8._0_8_ = (pointer)0x0;
    local_1d8._8_8_ = (pointer)0x0;
    local_1d8._16_8_ = (pointer)0x0;
    Config(__return_storage_ptr__,bVar4,&sampler,&reporter,&headers,&baggageRestrictions,
           &serviceName,(vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_1d8
          );
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
              ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)baggageRestrictions._hostPort._M_dataplus._M_p != &baggageRestrictions._hostPort.field_2)
    {
      operator_delete(baggageRestrictions._hostPort._M_dataplus._M_p);
    }
    if (baggageRestrictionsNode.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (baggageRestrictionsNode.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)headers._traceBaggageHeaderPrefix._M_dataplus._M_p !=
        &headers._traceBaggageHeaderPrefix.field_2) {
      operator_delete(headers._traceBaggageHeaderPrefix._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)headers._traceContextHeaderName._M_dataplus._M_p !=
        &headers._traceContextHeaderName.field_2) {
      operator_delete(headers._traceContextHeaderName._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)headers._jaegerBaggageHeader._M_dataplus._M_p != &headers._jaegerBaggageHeader.field_2) {
      operator_delete(headers._jaegerBaggageHeader._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(headers._jaegerDebugHeader._M_dataplus._M_p._1_7_,
                    headers._jaegerDebugHeader._M_dataplus._M_p._0_1_) !=
        &headers._jaegerDebugHeader.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(headers._jaegerDebugHeader._M_dataplus._M_p._1_7_,
                               headers._jaegerDebugHeader._M_dataplus._M_p._0_1_));
    }
    if (headersNode.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (headersNode.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)reporter._endpoint._M_dataplus._M_p != &reporter._endpoint.field_2) {
      operator_delete(reporter._endpoint._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)reporter._localAgentHostPort._M_dataplus._M_p != &reporter._localAgentHostPort.field_2) {
      operator_delete(reporter._localAgentHostPort._M_dataplus._M_p);
    }
    if (reporterNode.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (reporterNode.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sampler._samplingServerURL._M_dataplus._M_p != &sampler._samplingServerURL.field_2) {
      operator_delete(sampler._samplingServerURL._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sampler._type._M_dataplus._M_p != &sampler._type.field_2) {
      operator_delete(sampler._type._M_dataplus._M_p);
    }
    if (samplerNode.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (samplerNode.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)serviceName._M_dataplus._M_p == &serviceName.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    serviceName._M_dataplus._M_p = (pointer)&serviceName.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&serviceName,"remote","");
    p_Var1 = &samplerNode.m_pMemory.
              super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    samplerNode._0_8_ = p_Var1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&samplerNode,"http://127.0.0.1:5778/sampling","");
    local_168.__r = 60000000000;
    samplers::Config::Config(&sampler,&serviceName,0.001,(string *)&samplerNode,2000,&local_168);
    local_200.__r = 10000000000;
    reporterNode._0_8_ =
         &reporterNode.m_pMemory.
          super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::_M_construct<char_const*>((string *)&reporterNode,"127.0.0.1:6831","");
    headersNode._0_8_ =
         &headersNode.m_pMemory.
          super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::_M_construct<char_const*>((string *)&headersNode,"");
    reporters::Config::Config
              (&reporter,100,&local_200,false,(string *)&reporterNode,(string *)&headersNode);
    propagation::HeadersConfig::HeadersConfig(&headers);
    p_Var2 = &baggageRestrictionsNode.m_pMemory.
              super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    baggageRestrictionsNode._0_8_ = p_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&baggageRestrictionsNode,"");
    baggageRestrictions._denyBaggageOnInitializationFailure = false;
    paVar3 = &baggageRestrictions._hostPort.field_2;
    baggageRestrictions._hostPort._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&baggageRestrictions._hostPort,baggageRestrictionsNode._0_8_,
               (long)&((baggageRestrictionsNode.m_pMemory.
                        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->m_pMemory).
                      super___shared_ptr<YAML::detail::memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
               baggageRestrictionsNode._0_8_);
    baggageRestrictions._refreshInterval.__r = 0;
    local_1d8._0_8_ = (pointer)(local_1d8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8);
    local_188.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_188.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Config(__return_storage_ptr__,false,&sampler,&reporter,&headers,&baggageRestrictions,
           (string *)local_1d8,&local_188);
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_188);
    if ((pointer)local_1d8._0_8_ != (pointer)(local_1d8 + 0x10)) {
      operator_delete((void *)local_1d8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)baggageRestrictions._hostPort._M_dataplus._M_p != paVar3) {
      operator_delete(baggageRestrictions._hostPort._M_dataplus._M_p);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)baggageRestrictionsNode._0_8_ != p_Var2) {
      operator_delete((void *)baggageRestrictionsNode._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)headers._traceBaggageHeaderPrefix._M_dataplus._M_p !=
        &headers._traceBaggageHeaderPrefix.field_2) {
      operator_delete(headers._traceBaggageHeaderPrefix._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)headers._traceContextHeaderName._M_dataplus._M_p !=
        &headers._traceContextHeaderName.field_2) {
      operator_delete(headers._traceContextHeaderName._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)headers._jaegerBaggageHeader._M_dataplus._M_p != &headers._jaegerBaggageHeader.field_2) {
      operator_delete(headers._jaegerBaggageHeader._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(headers._jaegerDebugHeader._M_dataplus._M_p._1_7_,
                    headers._jaegerDebugHeader._M_dataplus._M_p._0_1_) !=
        &headers._jaegerDebugHeader.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(headers._jaegerDebugHeader._M_dataplus._M_p._1_7_,
                               headers._jaegerDebugHeader._M_dataplus._M_p._0_1_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)reporter._endpoint._M_dataplus._M_p != &reporter._endpoint.field_2) {
      operator_delete(reporter._endpoint._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)reporter._localAgentHostPort._M_dataplus._M_p != &reporter._localAgentHostPort.field_2) {
      operator_delete(reporter._localAgentHostPort._M_dataplus._M_p);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)headersNode._0_8_ !=
        &headersNode.m_pMemory.
         super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
      operator_delete((void *)headersNode._0_8_);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)reporterNode._0_8_ !=
        &reporterNode.m_pMemory.
         super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
      operator_delete((void *)reporterNode._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sampler._samplingServerURL._M_dataplus._M_p != &sampler._samplingServerURL.field_2) {
      operator_delete(sampler._samplingServerURL._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sampler._type._M_dataplus._M_p != &sampler._type.field_2) {
      operator_delete(sampler._type._M_dataplus._M_p);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)samplerNode._0_8_ != p_Var1) {
      operator_delete((void *)samplerNode._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)serviceName._M_dataplus._M_p == &serviceName.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(serviceName._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

static Config parse(const YAML::Node& configYAML)
    {
        if (!configYAML.IsDefined() || !configYAML.IsMap()) {
            return Config();
        }

        const auto serviceName =
            utils::yaml::findOrDefault<std::string>(configYAML, "service_name", "");

        const auto disabled =
            utils::yaml::findOrDefault<bool>(configYAML, "disabled", false);
        const auto samplerNode = configYAML["sampler"];
        const auto sampler = samplers::Config::parse(samplerNode);
        const auto reporterNode = configYAML["reporter"];
        const auto reporter = reporters::Config::parse(reporterNode);
        const auto headersNode = configYAML["headers"];
        const auto headers = propagation::HeadersConfig::parse(headersNode);
        const auto baggageRestrictionsNode = configYAML["baggage_restrictions"];
        const auto baggageRestrictions =
            baggage::RestrictionsConfig::parse(baggageRestrictionsNode);
        return Config(
            disabled, sampler, reporter, headers, baggageRestrictions, serviceName);
    }